

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O1

void __thiscall indk::Position::setPosition(Position *this,Position *P)

{
  uint uVar1;
  uint uVar2;
  float *pfVar3;
  float *pfVar4;
  Error *this_00;
  ulong uVar5;
  float fVar6;
  
  uVar1 = P->DimensionsCount;
  uVar2 = this->DimensionsCount;
  if (uVar2 <= uVar1) {
    if ((ulong)uVar2 != 0) {
      pfVar3 = P->X;
      pfVar4 = this->X;
      uVar5 = 0;
      do {
        fVar6 = -1.0;
        if (uVar5 < uVar1) {
          fVar6 = pfVar3[uVar5];
        }
        pfVar4[uVar5] = fVar6;
        uVar5 = uVar5 + 1;
      } while (uVar2 != uVar5);
    }
    return;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x28);
  Error::Error(this_00,10);
  __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
}

Assistant:

unsigned int indk::Position::getDimensionsCount() const {
    return DimensionsCount;
}